

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::genReferences
          (VertexArrayObjectTest *this,Surface *vaoRef,Surface *defaultRef)

{
  deUint32 dVar1;
  GLenum GVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  PixelBufferAccess local_70;
  PixelBufferAccess local_48;
  Surface *local_20;
  Surface *defaultRef_local;
  Surface *vaoRef_local;
  VertexArrayObjectTest *this_local;
  
  local_20 = defaultRef;
  defaultRef_local = vaoRef;
  vaoRef_local = (Surface *)this;
  setState(this,&(this->m_spec).vao);
  do {
    dVar1 = glu::ShaderProgram::getProgram(this->m_vaoProgram);
    glwUseProgram(dVar1);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glUseProgram(m_vaoProgram->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x270);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  makeDrawCall(this,&(this->m_spec).vao);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_48,defaultRef_local);
  glu::readPixels(pRVar4,0,0,&local_48);
  setState(this,&(this->m_spec).state);
  do {
    dVar1 = glu::ShaderProgram::getProgram(this->m_stateProgram);
    glwUseProgram(dVar1);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glUseProgram(m_stateProgram->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x275);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  makeDrawCall(this,&(this->m_spec).state);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_70,local_20);
  glu::readPixels(pRVar4,0,0,&local_70);
  return;
}

Assistant:

void VertexArrayObjectTest::genReferences (tcu::Surface& vaoRef, tcu::Surface& defaultRef)
{
	setState(m_spec.vao);
	GLU_CHECK_CALL(glUseProgram(m_vaoProgram->getProgram()));
	makeDrawCall(m_spec.vao);
	glu::readPixels(m_context.getRenderContext(), 0, 0, vaoRef.getAccess());

	setState(m_spec.state);
	GLU_CHECK_CALL(glUseProgram(m_stateProgram->getProgram()));
	makeDrawCall(m_spec.state);
	glu::readPixels(m_context.getRenderContext(), 0, 0, defaultRef.getAccess());
}